

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O2

Aig_Man_t * Fra_OneHotCreateExdc(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  Aig_Man_t *pAVar1;
  uint uVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  int i;
  uint uVar7;
  
  p_00 = Aig_ManStart(vOneHots->nSize / 2);
  iVar6 = 0;
  while( true ) {
    pAVar1 = p->pManAig;
    if (pAVar1->vCis->nSize <= iVar6) break;
    Vec_PtrEntry(pAVar1->vCis,iVar6);
    Aig_ObjCreateCi(p_00);
    iVar6 = iVar6 + 1;
  }
  iVar6 = pAVar1->nObjs[2] - pAVar1->nRegs;
  for (i = 0; i < vOneHots->nSize; i = i + 2) {
    uVar2 = Vec_IntEntry(vOneHots,i);
    uVar3 = Vec_IntEntry(vOneHots,i + 1);
    if (uVar2 != 0 || uVar3 != 0) {
      uVar7 = ~uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2 - 1;
      }
      pAVar4 = Aig_ManCi(p_00,uVar7 + iVar6);
      uVar7 = ~uVar3;
      if (0 < (int)uVar3) {
        uVar7 = uVar3 - 1;
      }
      pAVar5 = Aig_ManCi(p_00,uVar7 + iVar6);
      pAVar4 = Aig_Or(p_00,(Aig_Obj_t *)((ulong)(uVar2 >> 0x1f) ^ (ulong)pAVar4),
                      (Aig_Obj_t *)((ulong)(uVar3 >> 0x1f) ^ (ulong)pAVar5));
      Aig_ObjCreateCo(p_00,pAVar4);
    }
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Fra_OneHotCreateExdc( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj1, * pObj2, * pObj;
    int i, Out1, Out2, nTruePis;
    pNew = Aig_ManStart( Vec_IntSize(vOneHots)/2 );
//    for ( i = 0; i < Aig_ManRegNum(p->pManAig); i++ )
//        Aig_ObjCreateCi(pNew);
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Aig_ObjCreateCi(pNew);
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out2) );
        pObj1 = Aig_NotCond( pObj1, Fra_LitSign(Out1) );
        pObj2 = Aig_NotCond( pObj2, Fra_LitSign(Out2) );
        pObj  = Aig_Or( pNew, pObj1, pObj2 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    Aig_ManCleanup(pNew);
//    printf( "Created AIG with %d nodes and %d outputs.\n", Aig_ManNodeNum(pNew), Aig_ManCoNum(pNew) );
    return pNew;
}